

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O2

void __thiscall
soplex::
SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  pointer pnVar1;
  Item *pIVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  type_conflict5 tVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  undefined4 *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  multiprecision *pmVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  Item *pIVar19;
  bool bVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  len;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bias;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  multiprecision local_130 [112];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar21 = 0;
  if (this->state == DVEC) {
    iVar5 = (int)((ulong)((long)(this->vec).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vec).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 7);
    if ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum != iVar5) goto LAB_00437618;
    eps.m_backend.fpclass = cpp_dec_float_finite;
    eps.m_backend.prec_elem = 0x1c;
    eps.m_backend.data._M_elems[0] = 0;
    eps.m_backend.data._M_elems[1] = 0;
    eps.m_backend.data._M_elems[2] = 0;
    eps.m_backend.data._M_elems[3] = 0;
    eps.m_backend.data._M_elems[4] = 0;
    eps.m_backend.data._M_elems[5] = 0;
    eps.m_backend.data._M_elems[6] = 0;
    eps.m_backend.data._M_elems[7] = 0;
    eps.m_backend.data._M_elems[8] = 0;
    eps.m_backend.data._M_elems[9] = 0;
    eps.m_backend.data._M_elems[10] = 0;
    eps.m_backend.data._M_elems[0xb] = 0;
    eps.m_backend.data._M_elems[0xc] = 0;
    eps.m_backend.data._M_elems[0xd] = 0;
    eps.m_backend.data._M_elems[0xe] = 0;
    eps.m_backend.data._M_elems[0xf] = 0;
    eps.m_backend.data._M_elems[0x10] = 0;
    eps.m_backend.data._M_elems[0x11] = 0;
    eps.m_backend.data._M_elems[0x12] = 0;
    eps.m_backend.data._M_elems[0x13] = 0;
    eps.m_backend.data._M_elems[0x14] = 0;
    eps.m_backend.data._M_elems[0x15] = 0;
    eps.m_backend.data._M_elems[0x16] = 0;
    eps.m_backend.data._M_elems[0x17] = 0;
    eps.m_backend.data._M_elems[0x18] = 0;
    eps.m_backend.data._M_elems[0x19] = 0;
    eps.m_backend.data._M_elems._104_5_ = 0;
    eps.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    eps.m_backend.exp = 0;
    eps.m_backend.neg = false;
    bias.m_backend.fpclass = cpp_dec_float_finite;
    bias.m_backend.prec_elem = 0x1c;
    bias.m_backend.data._M_elems[0] = 0;
    bias.m_backend.data._M_elems[1] = 0;
    bias.m_backend.data._M_elems[2] = 0;
    bias.m_backend.data._M_elems[3] = 0;
    bias.m_backend.data._M_elems[4] = 0;
    bias.m_backend.data._M_elems[5] = 0;
    bias.m_backend.data._M_elems[6] = 0;
    bias.m_backend.data._M_elems[7] = 0;
    bias.m_backend.data._M_elems[8] = 0;
    bias.m_backend.data._M_elems[9] = 0;
    bias.m_backend.data._M_elems[10] = 0;
    bias.m_backend.data._M_elems[0xb] = 0;
    bias.m_backend.data._M_elems[0xc] = 0;
    bias.m_backend.data._M_elems[0xd] = 0;
    bias.m_backend.data._M_elems[0xe] = 0;
    bias.m_backend.data._M_elems[0xf] = 0;
    bias.m_backend.data._M_elems[0x18] = 0;
    bias.m_backend.data._M_elems[0x19] = 0;
    bias.m_backend.data._M_elems._104_5_ = 0;
    bias.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    bias.m_backend.exp = 0;
    bias.m_backend.neg = false;
    bias.m_backend.data._M_elems[0x10] = 0;
    bias.m_backend.data._M_elems[0x11] = 0;
    bias.m_backend.data._M_elems[0x12] = 0;
    bias.m_backend.data._M_elems[0x13] = 0;
    bias.m_backend.data._M_elems[0x14] = 0;
    bias.m_backend.data._M_elems[0x15] = 0;
    bias.m_backend.data._M_elems[0x16] = 0;
    bias.m_backend.data._M_elems[0x17] = 0;
    len.m_backend.fpclass = cpp_dec_float_finite;
    len.m_backend.prec_elem = 0x1c;
    len.m_backend.data._M_elems[0] = 0;
    len.m_backend.data._M_elems[1] = 0;
    len.m_backend.data._M_elems[2] = 0;
    len.m_backend.data._M_elems[3] = 0;
    len.m_backend.data._M_elems[4] = 0;
    len.m_backend.data._M_elems[5] = 0;
    len.m_backend.data._M_elems[6] = 0;
    len.m_backend.data._M_elems[7] = 0;
    len.m_backend.data._M_elems[8] = 0;
    len.m_backend.data._M_elems[9] = 0;
    len.m_backend.data._M_elems[10] = 0;
    len.m_backend.data._M_elems[0xb] = 0;
    len.m_backend.data._M_elems[0xc] = 0;
    len.m_backend.data._M_elems[0xd] = 0;
    len.m_backend.data._M_elems[0xe] = 0;
    len.m_backend.data._M_elems[0xf] = 0;
    len.m_backend.data._M_elems[0x10] = 0;
    len.m_backend.data._M_elems[0x11] = 0;
    len.m_backend.data._M_elems[0x12] = 0;
    len.m_backend.data._M_elems[0x13] = 0;
    len.m_backend.data._M_elems[0x18] = 0;
    len.m_backend.data._M_elems[0x19] = 0;
    len.m_backend.data._M_elems._104_5_ = 0;
    len.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    len.m_backend.exp = 0;
    len.m_backend.neg = false;
    len.m_backend.data._M_elems[0x14] = 0;
    len.m_backend.data._M_elems[0x15] = 0;
    len.m_backend.data._M_elems[0x16] = 0;
    len.m_backend.data._M_elems[0x17] = 0;
    lVar6 = (long)iVar5;
    lVar7 = lVar6 << 7;
    while( true ) {
      bVar20 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (bVar20) break;
      pnVar1 = (this->vec).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar11 = (undefined4 *)((long)&pnVar1[-1].m_backend.data + lVar7);
      pmVar16 = local_130;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined4 *)pmVar16 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
        pmVar16 = pmVar16 + (ulong)bVar21 * -8 + 4;
      }
      local_c0 = *(undefined4 *)((long)&pnVar1[-1].m_backend.data + lVar7 + 0x70);
      local_bc = *(undefined1 *)((long)&pnVar1[-1].m_backend.data + lVar7 + 0x74);
      local_b8 = *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar7 + 0x78);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((type *)&result_15.m_backend,local_130,in_RDX);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)
                 ((long)&(this->
                         super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).rowWeight.data.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar7),
                 &result_15.m_backend);
      in_RDX = extraout_RDX;
      lVar7 = lVar7 + -0x80;
    }
    lVar7 = (long)(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    while (bVar20 = lVar7 != 0, lVar7 = lVar7 + -1, bVar20) {
      pIVar2 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar5 = (base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar7].idx;
      pIVar19 = pIVar2 + iVar5;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&len.m_backend,0);
      pnVar13 = &len;
      pnVar18 = &bias;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      bias.m_backend.exp = len.m_backend.exp;
      bias.m_backend.neg = len.m_backend.neg;
      bias.m_backend.fpclass = len.m_backend.fpclass;
      bias.m_backend.prec_elem = len.m_backend.prec_elem;
      lVar9 = (long)pIVar2[iVar5].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused;
      lVar6 = lVar9 * 0x84;
      while (bVar20 = lVar9 != 0, lVar9 = lVar9 + -1, bVar20) {
        pNVar3 = (pIVar19->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        puVar15 = (uint *)((long)&pNVar3[-1].val.m_backend.data + lVar6);
        pcVar14 = &eps.m_backend;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar14->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
        }
        eps.m_backend.exp = *(int *)((long)&(pNVar3->val).m_backend.data + lVar6 + -0x14);
        eps.m_backend.neg = *(bool *)((long)&(pNVar3->val).m_backend.data + lVar6 + -0x10);
        eps.m_backend._120_8_ = *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar6 + -0xc);
        result_15.m_backend.fpclass = cpp_dec_float_finite;
        result_15.m_backend.prec_elem = 0x1c;
        result_15.m_backend.data._M_elems[0] = 0;
        result_15.m_backend.data._M_elems[1] = 0;
        result_15.m_backend.data._M_elems[2] = 0;
        result_15.m_backend.data._M_elems[3] = 0;
        result_15.m_backend.data._M_elems[4] = 0;
        result_15.m_backend.data._M_elems[5] = 0;
        result_15.m_backend.data._M_elems[6] = 0;
        result_15.m_backend.data._M_elems[7] = 0;
        result_15.m_backend.data._M_elems[8] = 0;
        result_15.m_backend.data._M_elems[9] = 0;
        result_15.m_backend.data._M_elems[10] = 0;
        result_15.m_backend.data._M_elems[0xb] = 0;
        result_15.m_backend.data._M_elems[0xc] = 0;
        result_15.m_backend.data._M_elems[0xd] = 0;
        result_15.m_backend.data._M_elems[0xe] = 0;
        result_15.m_backend.data._M_elems[0xf] = 0;
        result_15.m_backend.data._M_elems[0x10] = 0;
        result_15.m_backend.data._M_elems[0x11] = 0;
        result_15.m_backend.data._M_elems[0x12] = 0;
        result_15.m_backend.data._M_elems[0x13] = 0;
        result_15.m_backend.data._M_elems[0x14] = 0;
        result_15.m_backend.data._M_elems[0x15] = 0;
        result_15.m_backend.data._M_elems[0x16] = 0;
        result_15.m_backend.data._M_elems[0x17] = 0;
        result_15.m_backend.data._M_elems[0x18] = 0;
        result_15.m_backend.data._M_elems[0x19] = 0;
        result_15.m_backend.data._M_elems._104_5_ = 0;
        result_15.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_15.m_backend.exp = 0;
        result_15.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_15.m_backend,
                   &(this->vec).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)&(((pIVar19->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val).m_backend.data + lVar6 + -4)].m_backend,
                   &eps.m_backend);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&bias.m_backend,&result_15.m_backend);
        result_15.m_backend.fpclass = cpp_dec_float_finite;
        result_15.m_backend.prec_elem = 0x1c;
        result_15.m_backend.data._M_elems[0] = 0;
        result_15.m_backend.data._M_elems[1] = 0;
        result_15.m_backend.data._M_elems[2] = 0;
        result_15.m_backend.data._M_elems[3] = 0;
        result_15.m_backend.data._M_elems[4] = 0;
        result_15.m_backend.data._M_elems[5] = 0;
        result_15.m_backend.data._M_elems[6] = 0;
        result_15.m_backend.data._M_elems[7] = 0;
        result_15.m_backend.data._M_elems[8] = 0;
        result_15.m_backend.data._M_elems[9] = 0;
        result_15.m_backend.data._M_elems[10] = 0;
        result_15.m_backend.data._M_elems[0xb] = 0;
        result_15.m_backend.data._M_elems[0xc] = 0;
        result_15.m_backend.data._M_elems[0xd] = 0;
        result_15.m_backend.data._M_elems[0xe] = 0;
        result_15.m_backend.data._M_elems[0xf] = 0;
        result_15.m_backend.data._M_elems[0x10] = 0;
        result_15.m_backend.data._M_elems[0x11] = 0;
        result_15.m_backend.data._M_elems[0x12] = 0;
        result_15.m_backend.data._M_elems[0x13] = 0;
        result_15.m_backend.data._M_elems[0x14] = 0;
        result_15.m_backend.data._M_elems[0x15] = 0;
        result_15.m_backend.data._M_elems[0x16] = 0;
        result_15.m_backend.data._M_elems[0x17] = 0;
        result_15.m_backend.data._M_elems[0x18] = 0;
        result_15.m_backend.data._M_elems[0x19] = 0;
        result_15.m_backend.data._M_elems._104_5_ = 0;
        result_15.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_15.m_backend.exp = 0;
        result_15.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_15.m_backend,&eps.m_backend,&eps.m_backend);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&len.m_backend,&result_15.m_backend);
        lVar6 = lVar6 + -0x84;
      }
      result_15.m_backend.data._M_elems._0_8_ =
           result_15.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar4 = boost::multiprecision::operator>(&len,(int *)&result_15.m_backend);
      if (tVar4) {
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&bias.m_backend,&len.m_backend);
        result_18.m_backend.fpclass = cpp_dec_float_finite;
        result_18.m_backend.prec_elem = 0x1c;
        result_18.m_backend.data._M_elems[0] = 0;
        result_18.m_backend.data._M_elems[1] = 0;
        result_18.m_backend.data._M_elems[2] = 0;
        result_18.m_backend.data._M_elems[3] = 0;
        result_18.m_backend.data._M_elems[4] = 0;
        result_18.m_backend.data._M_elems[5] = 0;
        result_18.m_backend.data._M_elems[6] = 0;
        result_18.m_backend.data._M_elems[7] = 0;
        result_18.m_backend.data._M_elems[8] = 0;
        result_18.m_backend.data._M_elems[9] = 0;
        result_18.m_backend.data._M_elems[10] = 0;
        result_18.m_backend.data._M_elems[0xb] = 0;
        result_18.m_backend.data._M_elems[0xc] = 0;
        result_18.m_backend.data._M_elems[0xd] = 0;
        result_18.m_backend.data._M_elems[0xe] = 0;
        result_18.m_backend.data._M_elems[0xf] = 0;
        result_18.m_backend.data._M_elems[0x10] = 0;
        result_18.m_backend.data._M_elems[0x11] = 0;
        result_18.m_backend.data._M_elems[0x12] = 0;
        result_18.m_backend.data._M_elems[0x13] = 0;
        result_18.m_backend.data._M_elems[0x14] = 0;
        result_18.m_backend.data._M_elems[0x15] = 0;
        result_18.m_backend.data._M_elems[0x16] = 0;
        result_18.m_backend.data._M_elems[0x17] = 0;
        result_18.m_backend.data._M_elems[0x18] = 0;
        result_18.m_backend.data._M_elems[0x19] = 0;
        result_18.m_backend.data._M_elems._104_5_ = 0;
        result_18.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_18.m_backend.exp = 0;
        result_18.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_18.m_backend,&result.m_backend,
                   &(base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .object.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&result_15.m_backend,(multiprecision *)&result_18.m_backend,arg);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&(this->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).colWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend,&result_15.m_backend)
        ;
      }
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum !=
        (int)((ulong)((long)(this->vec).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->vec).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 7))) {
LAB_00437618:
      SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setupWeights(&this->
                      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,base);
      return;
    }
    this_00 = &this->vec;
    this_01 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&eps.m_backend,base);
    bias.m_backend.fpclass = cpp_dec_float_finite;
    bias.m_backend.prec_elem = 0x1c;
    bias.m_backend.data._M_elems[0] = 0;
    bias.m_backend.data._M_elems[1] = 0;
    bias.m_backend.data._M_elems[2] = 0;
    bias.m_backend.data._M_elems[3] = 0;
    bias.m_backend.data._M_elems[4] = 0;
    bias.m_backend.data._M_elems[5] = 0;
    bias.m_backend.data._M_elems[6] = 0;
    bias.m_backend.data._M_elems[7] = 0;
    bias.m_backend.data._M_elems[8] = 0;
    bias.m_backend.data._M_elems[9] = 0;
    bias.m_backend.data._M_elems[10] = 0;
    bias.m_backend.data._M_elems[0xb] = 0;
    bias.m_backend.data._M_elems[0xc] = 0;
    bias.m_backend.data._M_elems[0xd] = 0;
    bias.m_backend.data._M_elems[0xe] = 0;
    bias.m_backend.data._M_elems[0xf] = 0;
    bias.m_backend.data._M_elems[0x18] = 0;
    bias.m_backend.data._M_elems[0x19] = 0;
    bias.m_backend.data._M_elems._104_5_ = 0;
    bias.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    bias.m_backend.exp = 0;
    bias.m_backend.neg = false;
    bias.m_backend.data._M_elems[0x10] = 0;
    bias.m_backend.data._M_elems[0x11] = 0;
    bias.m_backend.data._M_elems[0x12] = 0;
    bias.m_backend.data._M_elems[0x13] = 0;
    bias.m_backend.data._M_elems[0x14] = 0;
    bias.m_backend.data._M_elems[0x15] = 0;
    bias.m_backend.data._M_elems[0x16] = 0;
    bias.m_backend.data._M_elems[0x17] = 0;
    len.m_backend.data._M_elems[0] = 10000;
    len.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
              (&bias.m_backend,&eps.m_backend,(longlong *)&len);
    len.m_backend.fpclass = cpp_dec_float_finite;
    len.m_backend.prec_elem = 0x1c;
    len.m_backend.data._M_elems[0] = 0;
    len.m_backend.data._M_elems[1] = 0;
    len.m_backend.data._M_elems[2] = 0;
    len.m_backend.data._M_elems[3] = 0;
    len.m_backend.data._M_elems[4] = 0;
    len.m_backend.data._M_elems[5] = 0;
    len.m_backend.data._M_elems[6] = 0;
    len.m_backend.data._M_elems[7] = 0;
    len.m_backend.data._M_elems[8] = 0;
    len.m_backend.data._M_elems[9] = 0;
    len.m_backend.data._M_elems[10] = 0;
    len.m_backend.data._M_elems[0xb] = 0;
    len.m_backend.data._M_elems[0xc] = 0;
    len.m_backend.data._M_elems[0xd] = 0;
    len.m_backend.data._M_elems[0xe] = 0;
    len.m_backend.data._M_elems[0xf] = 0;
    len.m_backend.data._M_elems[0x10] = 0;
    len.m_backend.data._M_elems[0x11] = 0;
    len.m_backend.data._M_elems[0x12] = 0;
    len.m_backend.data._M_elems[0x13] = 0;
    len.m_backend.data._M_elems[0x14] = 0;
    len.m_backend.data._M_elems[0x15] = 0;
    len.m_backend.data._M_elems[0x16] = 0;
    len.m_backend.data._M_elems[0x17] = 0;
    len.m_backend.data._M_elems[0x18] = 0;
    len.m_backend.data._M_elems[0x19] = 0;
    len.m_backend.data._M_elems._104_5_ = 0;
    len.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    len.m_backend.exp = 0;
    len.m_backend.neg = false;
    result_15.m_backend.fpclass = cpp_dec_float_finite;
    result_15.m_backend.prec_elem = 0x1c;
    result_15.m_backend.data._M_elems[0] = 0;
    result_15.m_backend.data._M_elems[1] = 0;
    result_15.m_backend.data._M_elems[2] = 0;
    result_15.m_backend.data._M_elems[3] = 0;
    result_15.m_backend.data._M_elems[4] = 0;
    result_15.m_backend.data._M_elems[5] = 0;
    result_15.m_backend.data._M_elems[6] = 0;
    result_15.m_backend.data._M_elems[7] = 0;
    result_15.m_backend.data._M_elems[8] = 0;
    result_15.m_backend.data._M_elems[9] = 0;
    result_15.m_backend.data._M_elems[10] = 0;
    result_15.m_backend.data._M_elems[0xb] = 0;
    result_15.m_backend.data._M_elems[0xc] = 0;
    result_15.m_backend.data._M_elems[0xd] = 0;
    result_15.m_backend.data._M_elems[0xe] = 0;
    result_15.m_backend.data._M_elems[0xf] = 0;
    result_15.m_backend.data._M_elems[0x10] = 0;
    result_15.m_backend.data._M_elems[0x11] = 0;
    result_15.m_backend.data._M_elems[0x12] = 0;
    result_15.m_backend.data._M_elems[0x13] = 0;
    result_15.m_backend.data._M_elems[0x14] = 0;
    result_15.m_backend.data._M_elems[0x15] = 0;
    result_15.m_backend.data._M_elems[0x16] = 0;
    result_15.m_backend.data._M_elems[0x17] = 0;
    result_15.m_backend.data._M_elems[0x18] = 0;
    result_15.m_backend.data._M_elems[0x19] = 0;
    result_15.m_backend.data._M_elems._104_5_ = 0;
    result_15.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_15.m_backend.exp = 0;
    result_15.m_backend.neg = false;
    lVar6 = (long)(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    lVar7 = 0x1c;
    lVar9 = lVar6 << 7;
    while( true ) {
      if (lVar6 == 0) break;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(this_00->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9),
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9));
      pcVar14 = &result.m_backend;
      pnVar13 = &len;
      for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      len.m_backend.exp = result.m_backend.exp;
      len.m_backend.neg = result.m_backend.neg;
      len.m_backend.fpclass = result.m_backend.fpclass;
      len.m_backend.prec_elem = result.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      pnVar13 = &result_15;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9),
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(this_00->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9));
      pcVar14 = &result.m_backend;
      pnVar18 = pnVar13;
      for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      result_15.m_backend.exp = result.m_backend.exp;
      result_15.m_backend.neg = result.m_backend.neg;
      result_15.m_backend.fpclass = result.m_backend.fpclass;
      result_15.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar4 = boost::multiprecision::operator<(&len,pnVar13);
      pnVar18 = &result_8;
      lVar8 = lVar7;
      pnVar10 = &len;
      if (tVar4) {
        for (; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        result_8.m_backend.exp = len.m_backend.exp;
        result_8.m_backend.neg = len.m_backend.neg;
        result_8.m_backend.fpclass = len.m_backend.fpclass;
        result_8.m_backend.prec_elem = len.m_backend.prec_elem;
        if (len.m_backend.fpclass != cpp_dec_float_finite ||
            result_8.m_backend.data._M_elems[0] != 0) {
          result_8.m_backend.neg = (bool)(len.m_backend.neg ^ 1);
        }
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_2.m_backend,&bias.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(this_01->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9));
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&result_8.m_backend,&result_2.m_backend);
        pnVar1 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).colWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = &result.m_backend;
        puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar9);
        for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar15 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
        }
        *(int *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x70) = result.m_backend.exp;
        *(bool *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x74) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x78) = result.m_backend._120_8_;
        bVar20 = false;
      }
      else {
        for (; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        result_8.m_backend.exp = result_15.m_backend.exp;
        result_8.m_backend.neg = result_15.m_backend.neg;
        result_8.m_backend.fpclass = result_15.m_backend.fpclass;
        result_8.m_backend.prec_elem = result_15.m_backend.prec_elem;
        if (result_15.m_backend.fpclass != cpp_dec_float_finite ||
            result_8.m_backend.data._M_elems[0] != 0) {
          result_8.m_backend.neg = (bool)(result_15.m_backend.neg ^ 1);
        }
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_2.m_backend,&bias.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(this_01->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9));
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&result_8.m_backend,&result_2.m_backend);
        pnVar1 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).colWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = &result.m_backend;
        puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar9);
        for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar15 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
        }
        *(int *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x70) = result.m_backend.exp;
        *(bool *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x74) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x78) = result.m_backend._120_8_;
        bVar20 = true;
      }
      (this->
      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).colUp.data[lVar6 + -1] = bVar20;
      lVar6 = lVar6 + -1;
      lVar9 = lVar9 + -0x80;
    }
    lVar7 = (long)(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    lVar6 = lVar7 << 7;
    while( true ) {
      lVar9 = 0x1c;
      if (lVar7 == 0) break;
      pIVar19 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar7 + -1].idx;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&result.m_backend,this_00,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)pIVar19);
      pcVar14 = &result_15.m_backend;
      pcVar12 = &result.m_backend;
      pcVar17 = pcVar14;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar17->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar21 * -8 + 4);
      }
      result_15.m_backend.exp = result.m_backend.exp;
      result_15.m_backend.neg = result.m_backend.neg;
      result_15.m_backend.fpclass = result.m_backend.fpclass;
      result_15.m_backend.prec_elem = result.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,pcVar14,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar6));
      pnVar13 = &len;
      pcVar12 = &result.m_backend;
      pnVar18 = pnVar13;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      len.m_backend.exp = result.m_backend.exp;
      len.m_backend.neg = result.m_backend.neg;
      len.m_backend.fpclass = result.m_backend.fpclass;
      len.m_backend.prec_elem = result.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar6),
                 pcVar14);
      lVar9 = 0x1c;
      pcVar12 = &result.m_backend;
      pcVar17 = pcVar14;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar17->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar21 * -8 + 4);
      }
      result_15.m_backend.exp = result.m_backend.exp;
      result_15.m_backend.neg = result.m_backend.neg;
      result_15.m_backend.fpclass = result.m_backend.fpclass;
      result_15.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar4 = boost::multiprecision::operator<
                        (pnVar13,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)pcVar14);
      pnVar18 = &result_2;
      if (tVar4) {
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        result_2.m_backend.exp = len.m_backend.exp;
        result_2.m_backend.neg = len.m_backend.neg;
        result_2.m_backend.fpclass = len.m_backend.fpclass;
        result_2.m_backend.prec_elem = len.m_backend.prec_elem;
        if (len.m_backend.fpclass != cpp_dec_float_finite ||
            result_2.m_backend.data._M_elems[0] != 0) {
          result_2.m_backend.neg = (bool)(len.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_8_ =
             SEXT48((pIVar19->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 0x1c;
        result_7.m_backend.data._M_elems[0] = 0;
        result_7.m_backend.data._M_elems[1] = 0;
        result_7.m_backend.data._M_elems[2] = 0;
        result_7.m_backend.data._M_elems[3] = 0;
        result_7.m_backend.data._M_elems[4] = 0;
        result_7.m_backend.data._M_elems[5] = 0;
        result_7.m_backend.data._M_elems[6] = 0;
        result_7.m_backend.data._M_elems[7] = 0;
        result_7.m_backend.data._M_elems[8] = 0;
        result_7.m_backend.data._M_elems[9] = 0;
        result_7.m_backend.data._M_elems[10] = 0;
        result_7.m_backend.data._M_elems[0xb] = 0;
        result_7.m_backend.data._M_elems[0xc] = 0;
        result_7.m_backend.data._M_elems[0xd] = 0;
        result_7.m_backend.data._M_elems[0xe] = 0;
        result_7.m_backend.data._M_elems[0xf] = 0;
        result_7.m_backend.data._M_elems[0x10] = 0;
        result_7.m_backend.data._M_elems[0x11] = 0;
        result_7.m_backend.data._M_elems[0x12] = 0;
        result_7.m_backend.data._M_elems[0x13] = 0;
        result_7.m_backend.data._M_elems[0x14] = 0;
        result_7.m_backend.data._M_elems[0x15] = 0;
        result_7.m_backend.data._M_elems[0x16] = 0;
        result_7.m_backend.data._M_elems[0x17] = 0;
        result_7.m_backend.data._M_elems[0x18] = 0;
        result_7.m_backend.data._M_elems[0x19] = 0;
        result_7.m_backend.data._M_elems._104_5_ = 0;
        result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (&result_7.m_backend,&eps.m_backend,(longlong *)&result.m_backend);
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 0x1c;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems[6] = 0;
        result_8.m_backend.data._M_elems[7] = 0;
        result_8.m_backend.data._M_elems[8] = 0;
        result_8.m_backend.data._M_elems[9] = 0;
        result_8.m_backend.data._M_elems[10] = 0;
        result_8.m_backend.data._M_elems[0xb] = 0;
        result_8.m_backend.data._M_elems[0xc] = 0;
        result_8.m_backend.data._M_elems[0xd] = 0;
        result_8.m_backend.data._M_elems[0xe] = 0;
        result_8.m_backend.data._M_elems[0xf] = 0;
        result_8.m_backend.data._M_elems[0x10] = 0;
        result_8.m_backend.data._M_elems[0x11] = 0;
        result_8.m_backend.data._M_elems[0x12] = 0;
        result_8.m_backend.data._M_elems[0x13] = 0;
        result_8.m_backend.data._M_elems[0x14] = 0;
        result_8.m_backend.data._M_elems[0x15] = 0;
        result_8.m_backend.data._M_elems[0x16] = 0;
        result_8.m_backend.data._M_elems[0x17] = 0;
        result_8.m_backend.data._M_elems[0x18] = 0;
        result_8.m_backend.data._M_elems[0x19] = 0;
        result_8.m_backend.data._M_elems._104_5_ = 0;
        result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_8.m_backend.exp = 0;
        result_8.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_8.m_backend,&result_2.m_backend,&result_7.m_backend);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_b0,this_01,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar19);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 0x1c;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems[6] = 0;
        result_9.m_backend.data._M_elems[7] = 0;
        result_9.m_backend.data._M_elems[8] = 0;
        result_9.m_backend.data._M_elems[9] = 0;
        result_9.m_backend.data._M_elems[10] = 0;
        result_9.m_backend.data._M_elems[0xb] = 0;
        result_9.m_backend.data._M_elems[0xc] = 0;
        result_9.m_backend.data._M_elems[0xd] = 0;
        result_9.m_backend.data._M_elems[0xe] = 0;
        result_9.m_backend.data._M_elems[0xf] = 0;
        result_9.m_backend.data._M_elems[0x10] = 0;
        result_9.m_backend.data._M_elems[0x11] = 0;
        result_9.m_backend.data._M_elems[0x12] = 0;
        result_9.m_backend.data._M_elems[0x13] = 0;
        result_9.m_backend.data._M_elems[0x14] = 0;
        result_9.m_backend.data._M_elems[0x15] = 0;
        result_9.m_backend.data._M_elems[0x16] = 0;
        result_9.m_backend.data._M_elems[0x17] = 0;
        result_9.m_backend.data._M_elems[0x18] = 0;
        result_9.m_backend.data._M_elems[0x19] = 0;
        result_9.m_backend.data._M_elems._104_5_ = 0;
        result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_9.m_backend.exp = 0;
        result_9.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_9.m_backend,&bias.m_backend,&local_b0);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&result_8.m_backend,&result_9.m_backend);
        pnVar1 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).rowWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = &result.m_backend;
        puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar6);
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
        }
        *(int *)((long)&pnVar1[-1].m_backend.data + lVar6 + 0x70) = result.m_backend.exp;
        *(bool *)((long)&pnVar1[-1].m_backend.data + lVar6 + 0x74) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar6 + 0x78) = result.m_backend._120_8_;
        bVar20 = false;
      }
      else {
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        result_2.m_backend.exp = result_15.m_backend.exp;
        result_2.m_backend.neg = result_15.m_backend.neg;
        result_2.m_backend.fpclass = result_15.m_backend.fpclass;
        result_2.m_backend.prec_elem = result_15.m_backend.prec_elem;
        if (result_15.m_backend.fpclass != cpp_dec_float_finite ||
            result_2.m_backend.data._M_elems[0] != 0) {
          result_2.m_backend.neg = (bool)(result_15.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_8_ =
             SEXT48((pIVar19->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 0x1c;
        result_7.m_backend.data._M_elems[0] = 0;
        result_7.m_backend.data._M_elems[1] = 0;
        result_7.m_backend.data._M_elems[2] = 0;
        result_7.m_backend.data._M_elems[3] = 0;
        result_7.m_backend.data._M_elems[4] = 0;
        result_7.m_backend.data._M_elems[5] = 0;
        result_7.m_backend.data._M_elems[6] = 0;
        result_7.m_backend.data._M_elems[7] = 0;
        result_7.m_backend.data._M_elems[8] = 0;
        result_7.m_backend.data._M_elems[9] = 0;
        result_7.m_backend.data._M_elems[10] = 0;
        result_7.m_backend.data._M_elems[0xb] = 0;
        result_7.m_backend.data._M_elems[0xc] = 0;
        result_7.m_backend.data._M_elems[0xd] = 0;
        result_7.m_backend.data._M_elems[0xe] = 0;
        result_7.m_backend.data._M_elems[0xf] = 0;
        result_7.m_backend.data._M_elems[0x10] = 0;
        result_7.m_backend.data._M_elems[0x11] = 0;
        result_7.m_backend.data._M_elems[0x12] = 0;
        result_7.m_backend.data._M_elems[0x13] = 0;
        result_7.m_backend.data._M_elems[0x14] = 0;
        result_7.m_backend.data._M_elems[0x15] = 0;
        result_7.m_backend.data._M_elems[0x16] = 0;
        result_7.m_backend.data._M_elems[0x17] = 0;
        result_7.m_backend.data._M_elems[0x18] = 0;
        result_7.m_backend.data._M_elems[0x19] = 0;
        result_7.m_backend.data._M_elems._104_5_ = 0;
        result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (&result_7.m_backend,&eps.m_backend,(longlong *)&result.m_backend);
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 0x1c;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems[6] = 0;
        result_8.m_backend.data._M_elems[7] = 0;
        result_8.m_backend.data._M_elems[8] = 0;
        result_8.m_backend.data._M_elems[9] = 0;
        result_8.m_backend.data._M_elems[10] = 0;
        result_8.m_backend.data._M_elems[0xb] = 0;
        result_8.m_backend.data._M_elems[0xc] = 0;
        result_8.m_backend.data._M_elems[0xd] = 0;
        result_8.m_backend.data._M_elems[0xe] = 0;
        result_8.m_backend.data._M_elems[0xf] = 0;
        result_8.m_backend.data._M_elems[0x10] = 0;
        result_8.m_backend.data._M_elems[0x11] = 0;
        result_8.m_backend.data._M_elems[0x12] = 0;
        result_8.m_backend.data._M_elems[0x13] = 0;
        result_8.m_backend.data._M_elems[0x14] = 0;
        result_8.m_backend.data._M_elems[0x15] = 0;
        result_8.m_backend.data._M_elems[0x16] = 0;
        result_8.m_backend.data._M_elems[0x17] = 0;
        result_8.m_backend.data._M_elems[0x18] = 0;
        result_8.m_backend.data._M_elems[0x19] = 0;
        result_8.m_backend.data._M_elems._104_5_ = 0;
        result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_8.m_backend.exp = 0;
        result_8.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_8.m_backend,&result_2.m_backend,&result_7.m_backend);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_b0,this_01,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar19);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 0x1c;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems[6] = 0;
        result_9.m_backend.data._M_elems[7] = 0;
        result_9.m_backend.data._M_elems[8] = 0;
        result_9.m_backend.data._M_elems[9] = 0;
        result_9.m_backend.data._M_elems[10] = 0;
        result_9.m_backend.data._M_elems[0xb] = 0;
        result_9.m_backend.data._M_elems[0xc] = 0;
        result_9.m_backend.data._M_elems[0xd] = 0;
        result_9.m_backend.data._M_elems[0xe] = 0;
        result_9.m_backend.data._M_elems[0xf] = 0;
        result_9.m_backend.data._M_elems[0x10] = 0;
        result_9.m_backend.data._M_elems[0x11] = 0;
        result_9.m_backend.data._M_elems[0x12] = 0;
        result_9.m_backend.data._M_elems[0x13] = 0;
        result_9.m_backend.data._M_elems[0x14] = 0;
        result_9.m_backend.data._M_elems[0x15] = 0;
        result_9.m_backend.data._M_elems[0x16] = 0;
        result_9.m_backend.data._M_elems[0x17] = 0;
        result_9.m_backend.data._M_elems[0x18] = 0;
        result_9.m_backend.data._M_elems[0x19] = 0;
        result_9.m_backend.data._M_elems._104_5_ = 0;
        result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_9.m_backend.exp = 0;
        result_9.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_9.m_backend,&bias.m_backend,&local_b0);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&result_8.m_backend,&result_9.m_backend);
        pnVar1 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).rowWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = &result.m_backend;
        puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar6);
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
        }
        *(int *)((long)&pnVar1[-1].m_backend.data + lVar6 + 0x70) = result.m_backend.exp;
        *(bool *)((long)&pnVar1[-1].m_backend.data + lVar6 + 0x74) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar6 + 0x78) = result.m_backend._120_8_;
        bVar20 = true;
      }
      (this->
      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).rowRight.data[lVar7 + -1] = bVar20;
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + -0x80;
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}